

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::vSolveUrightNoNZ
          (CLUFactor<double> *this,double *vec,double *rhs,int *ridx,int rn,double eps)

{
  int *piVar1;
  pointer pdVar2;
  pointer pdVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int local_9c;
  int *local_98;
  int *local_90;
  int *local_88;
  double *local_80;
  CLUFactor<double> *local_78;
  double local_70;
  int *local_68;
  int *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68 = (this->row).orig;
  local_60 = (this->row).perm;
  local_88 = (this->col).orig;
  piVar1 = (this->u).col.idx;
  pdVar2 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_90 = (this->u).col.len;
  local_98 = (this->u).col.start;
  local_9c = rn;
  local_80 = vec;
  local_78 = this;
  local_70 = eps;
LAB_001a9ee7:
  piVar4 = local_68;
  if (0 < local_9c) {
    uVar6 = *ridx;
    if ((double)local_9c <= (double)(int)uVar6 * 0.2) {
      iVar5 = deQueueMax(ridx,&local_9c);
      iVar7 = piVar4[iVar5];
      local_58 = (local_78->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar7] * rhs[iVar7];
      rhs[iVar7] = 0.0;
      uStack_50 = 0;
      eps = local_70;
      if (local_70 < ABS(local_58)) {
        iVar7 = local_88[iVar5];
        local_80[iVar7] = local_58;
        iVar5 = local_90[iVar7];
        dVar11 = -local_58;
        lVar8 = (long)local_98[iVar7] << 2;
        uStack_40 = 0x8000000000000000;
        local_48 = dVar11;
        for (; 0 < iVar5; iVar5 = iVar5 + -1) {
          iVar7 = *(int *)((long)piVar1 + lVar8);
          dVar9 = rhs[iVar7];
          dVar10 = *(double *)((long)pdVar2 + lVar8 * 2);
          if ((dVar9 != 0.0) || (NAN(dVar9))) {
            dVar9 = dVar9 - dVar10 * local_58;
            rhs[iVar7] = (double)(-(ulong)(dVar9 == 0.0) & 0x2b2bff2ee48e0530) + dVar9;
          }
          else {
            dVar10 = dVar10 * dVar11;
            if (eps < ABS(dVar10)) {
              rhs[iVar7] = dVar10;
              enQueueMax(ridx,&local_9c,local_60[iVar7]);
              eps = local_70;
              dVar11 = local_48;
            }
          }
          lVar8 = lVar8 + 4;
        }
      }
      goto LAB_001a9ee7;
    }
    pdVar3 = (local_78->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      iVar7 = local_68[uVar6];
      dVar11 = pdVar3[iVar7] * rhs[iVar7];
      rhs[iVar7] = 0.0;
      if (eps < ABS(dVar11)) {
        iVar7 = local_88[uVar6];
        local_80[iVar7] = dVar11;
        lVar8 = (long)local_98[iVar7] << 2;
        for (iVar7 = local_90[iVar7]; 0 < iVar7; iVar7 = iVar7 + -1) {
          iVar5 = *(int *)((long)piVar1 + lVar8);
          rhs[iVar5] = rhs[iVar5] - *(double *)((long)pdVar2 + lVar8 * 2) * dVar11;
          lVar8 = lVar8 + 4;
        }
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}